

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* nivalis::OpCode::funcname_to_opcode_map_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  allocator_type local_90a;
  less<void> local_909;
  int local_908 [52];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_7c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_748;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_720;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_6d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_680;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_658;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_608;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_590;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_540;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_518;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_388;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_40;
  
  if (funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    if (iVar1 != 0) {
      local_908[0x33] = 0x32;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_838,(char (*) [4])"mod",(_OpCode *)(local_908 + 0x33));
      local_908[0x32] = 0x40;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_810,(char (*) [4])"pow",(_OpCode *)(local_908 + 0x32));
      local_908[0x31] = 0x41;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_7e8,(char (*) [4])"log",(_OpCode *)(local_908 + 0x31));
      local_908[0x30] = 0x50;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_7c0,(char (*) [4])"max",(_OpCode *)(local_908 + 0x30));
      local_908[0x2f] = 0x51;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_798,(char (*) [4])"min",(_OpCode *)(local_908 + 0x2f));
      local_908[0x2e] = 0x54;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_770,(char (*) [4])"xor",(_OpCode *)(local_908 + 0x2e));
      local_908[0x2d] = 0x8001;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_748,(char (*) [4])"not",(_OpCode *)(local_908 + 0x2d));
      local_908[0x2c] = 0x52;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_720,(char (*) [4])0x133a1d,(_OpCode *)(local_908 + 0x2c));
      local_908[0x2b] = 0x53;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (&local_6f8,(char (*) [3])0x1332a0,(_OpCode *)(local_908 + 0x2b));
      local_908[0x2a] = 0x8002;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_6d0,(char (*) [4])"abs",(_OpCode *)(local_908 + 0x2a));
      local_908[0x29] = 0x8003;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_6a8,(char (*) [5])0x133229,(_OpCode *)(local_908 + 0x29));
      local_908[0x28] = 0x8005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_680,(char (*) [4])"sgn",(_OpCode *)(local_908 + 0x28));
      local_908[0x27] = 0x8006;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_658,(char (*) [6])0x13329d,(_OpCode *)(local_908 + 0x27));
      local_908[0x26] = 0x8007;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_630,(char (*) [5])"ceil",(_OpCode *)(local_908 + 0x26));
      local_908[0x25] = 0x8008;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_608,(char (*) [6])"round",(_OpCode *)(local_908 + 0x25));
      local_908[0x24] = 0x8009;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_5e0,(char (*) [4])"exp",(_OpCode *)(local_908 + 0x24));
      local_908[0x23] = 0x800a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_5b8,(char (*) [5])"exp2",(_OpCode *)(local_908 + 0x23));
      local_908[0x22] = 0x800b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (&local_590,(char (*) [3])"ln",(_OpCode *)(local_908 + 0x22));
      local_908[0x21] = 0x800c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_568,(char (*) [6])"log10",(_OpCode *)(local_908 + 0x21));
      local_908[0x20] = 0x800d;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_540,(char (*) [5])"log2",(_OpCode *)(local_908 + 0x20));
      local_908[0x1f] = 0x800f;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_518,(char (*) [4])0x132bf1,(_OpCode *)(local_908 + 0x1f));
      local_908[0x1e] = 0x8010;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_4f0,(char (*) [4])0x132bf8,(_OpCode *)(local_908 + 0x1e));
      local_908[0x1d] = 0x8011;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_4c8,(char (*) [4])0x132bff,(_OpCode *)(local_908 + 0x1d));
      local_908[0x1c] = 0x8012;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_4a0,(char (*) [7])"arcsin",(_OpCode *)(local_908 + 0x1c));
      local_908[0x1b] = 0x8013;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_478,(char (*) [7])"arccos",(_OpCode *)(local_908 + 0x1b));
      local_908[0x1a] = 0x8014;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_450,(char (*) [7])"arctan",(_OpCode *)(local_908 + 0x1a));
      local_908[0x19] = 0x8015;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_428,(char (*) [5])"sinh",(_OpCode *)(local_908 + 0x19));
      local_908[0x18] = 0x8016;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_400,(char (*) [5])"cosh",(_OpCode *)(local_908 + 0x18));
      local_908[0x17] = 0x8017;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_3d8,(char (*) [5])"tanh",(_OpCode *)(local_908 + 0x17));
      local_908[0x16] = 0x8018;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_3b0,(char (*) [6])0x132c21,(_OpCode *)(local_908 + 0x16));
      local_908[0x15] = 0x8018;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_388,(char (*) [6])"Gamma",(_OpCode *)(local_908 + 0x15));
      local_908[0x14] = 0x800e;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_360,(char (*) [6])0x132c6b,(_OpCode *)(local_908 + 0x14));
      local_908[0x13] = 0x8019;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_338,(char (*) [7])"lgamma",(_OpCode *)(local_908 + 0x13));
      local_908[0x12] = 0x801a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (&local_310,(char (*) [8])"digamma",(_OpCode *)(local_908 + 0x12));
      local_908[0x11] = 0x801a;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_2e8,(char (*) [6])"psi_0",(_OpCode *)(local_908 + 0x11));
      local_908[0x10] = 0x801b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_2c0,(char (*) [9])"trigamma",(_OpCode *)(local_908 + 0x10));
      local_908[0xf] = 0x801b;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (&local_298,(char (*) [6])"psi_1",(_OpCode *)(local_908 + 0xf));
      local_908[0xe] = 0x4006;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[10],_nivalis::OpCode::_OpCode,_true>
                (&local_270,(char (*) [10])"polygamma",(_OpCode *)(local_908 + 0xe));
      local_908[0xd] = 0x801c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_248,(char (*) [4])"erf",(_OpCode *)(local_908 + 0xd));
      local_908[0xc] = 0x801d;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_220,(char (*) [5])"zeta",(_OpCode *)(local_908 + 0xc));
      local_908[0xb] = 0x4005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (&local_1f8,(char (*) [5])"beta",(_OpCode *)(local_908 + 0xb));
      local_908[10] = 0x4005;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_nivalis::OpCode::_OpCode,_true>
                (&local_1d0,(char (*) [2])0x1339b1,(_OpCode *)(local_908 + 10));
      local_908[9] = 0x4000;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_1a8,(char (*) [4])"gcd",(_OpCode *)(local_908 + 9));
      local_908[8] = 0x4001;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (&local_180,(char (*) [4])"lcm",(_OpCode *)(local_908 + 8));
      local_908[7] = 0x4002;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_158,(char (*) [7])"choose",(_OpCode *)(local_908 + 7));
      local_908[6] = 0x4003;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_130,(char (*) [7])"fafact",(_OpCode *)(local_908 + 6));
      local_908[5] = 0x4004;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (&local_108,(char (*) [7])"rifact",(_OpCode *)(local_908 + 5));
      local_908[4] = 0x801f;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_e0,(char (*) [9])"softplus",(_OpCode *)(local_908 + 4));
      local_908[3] = 0x801e;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (&local_b8,(char (*) [8])"sigmoid",(_OpCode *)(local_908 + 3));
      local_908[2] = 0x8020;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (&local_90,(char (*) [9])"gausspdf",(_OpCode *)(local_908 + 2));
      local_908[1] = 0xffffffff;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_int,_true>(&local_68,(char (*) [5])0x132c65,local_908 + 1);
      local_908[0] = -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_int,_true>(&local_40,(char (*) [2])0x1339b5,local_908);
      __l._M_len = 0x34;
      __l._M_array = &local_838;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::map(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_,__l,&local_909,&local_90a)
      ;
      lVar2 = -0x820;
      paVar3 = &local_40.first.field_2;
      do {
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar3->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],
                          paVar3->_M_allocated_capacity + 1);
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar3->_M_allocated_capacity + -5);
        lVar2 = lVar2 + 0x28;
      } while (lVar2 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::~map,&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    }
  }
  return &funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_;
}

Assistant:

const std::map<std::string, uint32_t, std::less<> >& funcname_to_opcode_map() {
    static std::map<std::string, uint32_t, std::less<> > func_opcodes = {
        {"mod", OpCode::mod},
        {"pow", OpCode::power},
        {"log", OpCode::logbase},
        {"max", OpCode::max},
        {"min", OpCode::min},
        {"xor", OpCode::lxor},
        {"not", OpCode::lnot},
        {"and", OpCode::land},
        {"or", OpCode::lor},

        {"abs", OpCode::absb},
        {"sqrt", OpCode::sqrtb},
        {"sgn", OpCode::sgn},
        {"floor", OpCode::floorb},
        {"ceil", OpCode::ceilb},
        {"round", OpCode::roundb},

        {"exp", OpCode::expb},
        {"exp2", OpCode::exp2b},
        {"ln", OpCode::logb},
        {"log10", OpCode::log10b},
        {"log2", OpCode::log2b},

        {"sin", OpCode::sinb},
        {"cos", OpCode::cosb},
        {"tan", OpCode::tanb},
        {"arcsin", OpCode::asinb},
        {"arccos", OpCode::acosb},
        {"arctan", OpCode::atanb},

        {"sinh", OpCode::sinhb},
        {"cosh", OpCode::coshb},
        {"tanh", OpCode::tanhb},

        {"gamma", OpCode::tgammab},
        {"Gamma", OpCode::tgammab},
        {"ifact", OpCode::factb},
        {"lgamma", OpCode::lgammab},
        {"digamma", OpCode::digammab},
        {"psi_0", OpCode::digammab},
        {"trigamma", OpCode::trigammab},
        {"psi_1", OpCode::trigammab},
        {"polygamma", OpCode::polygammab},
        {"erf", OpCode::erfb},
        {"zeta", OpCode::zetab},
        {"beta", OpCode::betab},
        {"B", OpCode::betab},
        {"gcd", OpCode::gcd},
        {"lcm", OpCode::lcm},
        {"choose", OpCode::choose},
        {"fafact", OpCode::fafact},
        {"rifact", OpCode::rifact},
        {"softplus", OpCode::softplusb},
        {"sigmoid", OpCode::sigmoidb},
        {"gausspdf", OpCode::gausspdfb},

        // -1 means fake command handled in parser
        {"fact", -1},
        {"N", -1}, // standard normal
    };
    return func_opcodes;
}